

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringUtils.hpp
# Opt level: O2

float OpenMD::lexi_cast<float>(string *str)

{
  istream *piVar1;
  ostream *poVar2;
  float result;
  istringstream iss;
  
  std::__cxx11::istringstream::istringstream((istringstream *)&iss,(string *)str,_S_in);
  piVar1 = std::istream::_M_extract<float>((float *)&iss);
  if (((&piVar1->field_0x20)[(long)piVar1->_vptr_basic_istream[-3]] & 5) != 0) {
    poVar2 = std::operator<<((ostream *)&std::cerr,"lexi_cast Error");
    std::endl<char,std::char_traits<char>>(poVar2);
  }
  std::__cxx11::istringstream::~istringstream((istringstream *)&iss);
  return result;
}

Assistant:

T lexi_cast(const std::string& str) {
    T result;
    std::istringstream iss(str);
    if (!(iss >> result)) { std::cerr << "lexi_cast Error" << std::endl; }
    return result;
  }